

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O1

QPushButton * __thiscall QDialogButtonBox::button(QDialogButtonBox *this,StandardButton which)

{
  long lVar1;
  long lVar2;
  
  lVar1 = *(long *)(this + 8);
  if (*(long *)(lVar1 + 0x338) != 0) {
    lVar2 = 0;
    do {
      if (*(StandardButton *)(*(long *)(lVar1 + 0x398) + lVar2 * 4) == which) {
        return *(QPushButton **)(*(long *)(lVar1 + 0x340) + lVar2 * 8);
      }
      lVar2 = lVar2 + 1;
    } while (*(long *)(lVar1 + 0x338) != lVar2);
  }
  return (QPushButton *)0x0;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }